

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SetEnum
          (ExtensionSet *this,int number,FieldType type,int value,FieldDescriptor *descriptor)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  LogFinisher local_fa;
  byte local_f9;
  LogMessage local_f8;
  LogFinisher local_ba;
  byte local_b9;
  LogMessage local_b8;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  Extension *local_30;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  FieldType local_15;
  int value_local;
  FieldType type_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)descriptor;
  descriptor_local._4_4_ = value;
  local_15 = type;
  value_local = number;
  pEStack_10 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,&local_30);
  if (bVar1) {
    local_30->type = local_15;
    CVar2 = anon_unknown_22::cpp_type(local_30->type);
    local_69 = 0;
    if (CVar2 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1fe);
      local_69 = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(local_7d,pLVar3);
    }
    if ((local_69 & 1) != 0) {
      LogMessage::~LogMessage(&local_68);
    }
    local_30->is_repeated = false;
  }
  else {
    local_b9 = 0;
    if ((local_30->is_repeated & 1U) != 0) {
      LogMessage::LogMessage
                (&local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x201);
      local_b9 = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_b8,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_ba,pLVar3);
    }
    if ((local_b9 & 1) != 0) {
      LogMessage::~LogMessage(&local_b8);
    }
    CVar2 = anon_unknown_22::cpp_type(local_30->type);
    local_f9 = 0;
    if (CVar2 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_f8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x201);
      local_f9 = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_f8,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_fa,pLVar3);
    }
    if ((local_f9 & 1) != 0) {
      LogMessage::~LogMessage(&local_f8);
    }
  }
  local_30->field_0xa = local_30->field_0xa & 0xf0;
  (local_30->field_0).int32_t_value = descriptor_local._4_4_;
  return;
}

Assistant:

void ExtensionSet::SetEnum(int number, FieldType type, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = false;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
  }
  extension->is_cleared = false;
  extension->enum_value = value;
}